

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O2

RK_S32 mpp_av1_uncompressed_header(AV1Context *ctx,BitReadCtx_t *gb,AV1RawFrameHeader *current)

{
  undefined4 uVar1;
  undefined4 uVar2;
  byte bVar3;
  undefined4 uVar4;
  RK_S32 RVar5;
  AV1RawSequenceHeader *seq;
  uint6 uVar6;
  bool bVar7;
  bool bVar8;
  RK_U8 RVar9;
  RK_S8 RVar10;
  RK_S32 RVar11;
  RK_S32 RVar12;
  RK_S32 RVar13;
  uint uVar14;
  uint uVar15;
  RK_U32 RVar16;
  MPP_RET MVar17;
  long lVar18;
  RK_U8 (*paRVar19) [8];
  byte bVar20;
  char cVar21;
  RK_S16 (*paRVar22) [8];
  char cVar23;
  short sVar24;
  int iVar25;
  RK_U32 RVar26;
  int iVar27;
  AV1Context *pAVar28;
  long lVar29;
  AV1RawSequenceHeader *pAVar30;
  uint blksize;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  RK_S32 *pRVar34;
  RK_S8 *pRVar35;
  uint uVar36;
  ulong uVar37;
  RK_U8 *pRVar38;
  int iVar39;
  ulong uVar40;
  bool bVar41;
  AV1RawFrameHeader *pAVar42;
  RK_U32 value;
  AV1RawFrameHeader *local_98;
  AV1Context *local_90;
  byte local_81;
  AV1RawSequenceHeader *local_80;
  AV1RawSequenceHeader *local_78;
  RK_U8 (*local_70) [8];
  RK_S16 (*local_68) [8];
  char cStack_60;
  RK_S8 ref_frame_idx [7];
  RK_U8 *local_58;
  RK_S16 (*local_50) [8];
  char acStack_48 [8];
  long local_40;
  AV1ReferenceFrameState *local_38;
  
  local_80 = ctx->sequence_header;
  if (local_80 == (AV1RawSequenceHeader *)0x0) {
    _mpp_log_l(2,"av1d_cbs","No sequence header available: unable to decode frame header.\n",
               "mpp_av1_uncompressed_header");
    return -2;
  }
  bVar20 = local_80->additional_frame_id_length_minus_1;
  bVar3 = local_80->delta_frame_id_length_minus_2;
  iVar32 = (uint)bVar3 + (uint)bVar20 + 3;
  local_98 = current;
  local_90 = (AV1Context *)gb;
  if (local_80->reduced_still_picture_header == '\0') {
    RVar12 = mpp_av1_read_unsigned(gb,1,"show_existing_frame",&value,0,1);
    if (RVar12 < 0) {
      return RVar12;
    }
    local_98->show_existing_frame = (byte)value;
    if ((byte)value != '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,3,"frame_to_show_map_idx",&value,0,7);
      pAVar42 = local_98;
      if (RVar12 < 0) {
        return -1;
      }
      uVar14 = value & 0xff;
      local_98->frame_to_show_map_idx = (RK_U8)value;
      if (ctx->ref_s[uVar14].valid == 0) {
        _mpp_log_l(2,"av1d_cbs",
                   "Missing reference frame needed for show_existing_frame (frame_to_show_map_idx = %d).\n"
                   ,"mpp_av1_uncompressed_header");
        return -2;
      }
      if ((local_80->decoder_model_info_present_flag != '\0') &&
         ((local_80->timing_info).equal_picture_interval == '\0')) {
        iVar25 = (local_80->decoder_model_info).frame_presentation_time_length_minus_1 + 1;
        RVar12 = mpp_av1_read_unsigned
                           (&local_90->gb,iVar25,"frame_presentation_time",&value,0,
                            ~(uint)(-1L << ((byte)iVar25 & 0x3f)));
        if (RVar12 < 0) {
          return -1;
        }
        pAVar42->frame_presentation_time = value;
      }
      if (local_80->frame_id_numbers_present_flag != '\0') {
        RVar12 = mpp_av1_read_unsigned
                           (&local_90->gb,iVar32,"display_frame_id",&value,0,
                            ~(uint)(-1L << ((byte)iVar32 & 0x3f)));
        if (RVar12 < 0) {
          return -1;
        }
        pAVar42->display_frame_id = value;
      }
      RVar9 = (RK_U8)ctx->ref_s[uVar14].frame_type;
      pAVar42->frame_type = RVar9;
      if (RVar9 == '\0') {
        pAVar42->current_frame_id = ctx->ref_s[uVar14].frame_id;
        RVar12 = ctx->ref_s[uVar14].upscaled_width;
        ctx->upscaled_width = RVar12;
        uVar1 = ctx->ref_s[uVar14].frame_width;
        uVar2 = ctx->ref_s[uVar14].frame_height;
        RVar13 = ctx->ref_s[uVar14].render_width;
        ctx->render_width = RVar13;
        RVar11 = ctx->ref_s[uVar14].render_height;
        ctx->render_height = RVar11;
        RVar5 = ctx->ref_s[uVar14].order_hint;
        ctx->bit_depth = ctx->ref_s[uVar14].bit_depth;
        ctx->order_hint = RVar5;
        ctx->frame_width = uVar1;
        ctx->frame_height = uVar2;
        sVar24 = (short)uVar2;
        RVar9 = 0xff;
      }
      else {
        RVar12 = ctx->ref_s[uVar14].upscaled_width;
        sVar24 = (short)ctx->ref_s[uVar14].frame_height;
        RVar13 = ctx->ref_s[uVar14].render_width;
        RVar11 = ctx->ref_s[uVar14].render_height;
        RVar9 = '\0';
      }
      pAVar42->refresh_frame_flags = RVar9;
      pAVar42->frame_width_minus_1 = (short)RVar12 - 1;
      pAVar42->frame_height_minus_1 = sVar24 - 1;
      pAVar42->render_width_minus_1 = (short)RVar13 - 1;
      pAVar42->render_height_minus_1 = (short)RVar11 - 1;
      return 0;
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"frame_type",&value,0,3);
    current = local_98;
    if (RVar12 < 0) {
      return -1;
    }
    local_98->frame_type = (byte)value;
    local_81 = (value & 0xfd) == 0;
    ctx->frame_is_intra = local_81;
    if ((byte)value == '\0') {
      Av1GetCDFs(ctx,(uint)local_98->frame_to_show_map_idx);
      Av1StoreCDFs(ctx,0xff);
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"show_frame",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    current->show_frame = (byte)value;
    if ((byte)value == '\0') {
LAB_001b9c4c:
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"showable_frame",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      current->showable_frame = (byte)value;
      RVar9 = current->frame_type;
    }
    else {
      if ((local_80->decoder_model_info_present_flag != '\0') &&
         ((local_80->timing_info).equal_picture_interval == '\0')) {
        iVar25 = (local_80->decoder_model_info).frame_presentation_time_length_minus_1 + 1;
        RVar12 = mpp_av1_read_unsigned
                           (&local_90->gb,iVar25,"frame_presentation_time",&value,0,
                            ~(uint)(-1L << ((byte)iVar25 & 0x3f)));
        if (RVar12 < 0) {
          return -1;
        }
        current->frame_presentation_time = value;
        if (current->show_frame == '\0') goto LAB_001b9c4c;
      }
      RVar9 = current->frame_type;
      current->showable_frame = RVar9 != '\0';
    }
    if ((RVar9 == '\x03') || ((RVar9 == '\0' && (current->show_frame != '\0')))) {
      current->error_resilient_mode = '\x01';
    }
    else {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"error_resilient_mode",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      current->error_resilient_mode = (byte)value;
      RVar9 = current->frame_type;
    }
    local_58 = &current->frame_type;
    if (RVar9 == '\0') goto LAB_001b98fb;
  }
  else {
    current->show_existing_frame = '\0';
    local_58 = &current->frame_type;
    current->frame_type = '\0';
    current->show_frame = '\x01';
    current->showable_frame = '\0';
    local_81 = 1;
LAB_001b98fb:
    if (current->show_frame != '\0') {
      for (lVar18 = 0; lVar18 != 0x7e0; lVar18 = lVar18 + 0xfc) {
        pRVar35 = ctx->ref_s[0].loop_filter_ref_deltas + lVar18 + -0x30;
        pRVar35[0] = '\0';
        pRVar35[1] = '\0';
        pRVar35[2] = '\0';
        pRVar35[3] = '\0';
        pRVar35 = ctx->ref_s[0].loop_filter_ref_deltas + lVar18 + -4;
        pRVar35[0] = '\0';
        pRVar35[1] = '\0';
        pRVar35[2] = '\0';
        pRVar35[3] = '\0';
      }
    }
  }
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"disable_cdf_update",&value,0,1);
  if (RVar12 < 0) {
    return -1;
  }
  current->disable_cdf_update = (byte)value;
  RVar9 = local_80->seq_force_screen_content_tools;
  if (RVar9 == '\x02') {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"allow_screen_content_tools",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    current->allow_screen_content_tools = (byte)value;
    RVar9 = (byte)value;
  }
  else {
    current->allow_screen_content_tools = RVar9;
  }
  if (RVar9 == '\0') {
    current->force_integer_mv = '\0';
  }
  else if (local_80->seq_force_integer_mv == '\x02') {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"force_integer_mv",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    current->force_integer_mv = (byte)value;
  }
  else {
    current->force_integer_mv = local_80->seq_force_integer_mv;
  }
  if (local_80->frame_id_numbers_present_flag == '\0') {
    current->current_frame_id = 0;
  }
  else {
    RVar12 = mpp_av1_read_unsigned
                       (&local_90->gb,iVar32,"current_frame_id",&value,0,
                        ~(uint)(-1L << ((byte)iVar32 & 0x3f)));
    if (RVar12 < 0) {
      return -1;
    }
    current->current_frame_id = value;
    iVar32 = 4 << (local_80->delta_frame_id_length_minus_2 & 0x1f);
    for (lVar18 = 0; lVar18 != 0x7e0; lVar18 = lVar18 + 0xfc) {
      iVar25 = *(int *)(ctx->ref_s[0].loop_filter_ref_deltas + lVar18 + -0x2c);
      if (iVar32 < (int)value) {
        iVar39 = -iVar32;
        if (iVar25 <= (int)value) {
joined_r0x001b9e41:
          if ((int)(iVar39 + value) <= iVar25) goto LAB_001b9e4b;
        }
        pRVar35 = ctx->ref_s[0].loop_filter_ref_deltas + lVar18 + -0x30;
        pRVar35[0] = '\0';
        pRVar35[1] = '\0';
        pRVar35[2] = '\0';
        pRVar35[3] = '\0';
      }
      else {
        iVar39 = (8 << (bVar3 + bVar20 & 0x1f)) - iVar32;
        if ((int)value < iVar25) goto joined_r0x001b9e41;
      }
LAB_001b9e4b:
    }
  }
  if (*local_58 == 3) {
    current->frame_size_override_flag = '\x01';
  }
  else if (local_80->reduced_still_picture_header == '\0') {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"frame_size_override_flag",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    current->frame_size_override_flag = (byte)value;
  }
  else {
    current->frame_size_override_flag = '\0';
  }
  if (local_80->enable_order_hint == '\0') {
    current->order_hint = '\0';
    uVar14 = 0;
    RVar12 = 0;
  }
  else {
    RVar12 = local_80->order_hint_bits_minus_1 + 1;
    RVar13 = mpp_av1_read_unsigned
                       (&local_90->gb,RVar12,"order_hint",&value,0,
                        ~(uint)(-1L << ((byte)RVar12 & 0x3f)));
    if (RVar13 < 0) {
      return -1;
    }
    uVar14 = value & 0xff;
    current->order_hint = (RK_U8)value;
  }
  ctx->order_hint = uVar14;
  if ((local_81 == 0) && (current->error_resilient_mode == '\0')) {
    RVar13 = mpp_av1_read_unsigned(&local_90->gb,3,"primary_ref_frame",&value,0,7);
    if (RVar13 < 0) {
      return -1;
    }
    current->primary_ref_frame = (byte)value;
  }
  else {
    current->primary_ref_frame = '\a';
  }
  pAVar30 = local_80;
  if (local_80->decoder_model_info_present_flag != '\0') {
    RVar13 = mpp_av1_read_unsigned(&local_90->gb,1,"buffer_removal_time_present_flag",&value,0,1);
    if (RVar13 < 0) {
      return -1;
    }
    local_98->buffer_removal_time_present_flag = (byte)value;
    pAVar30 = local_80;
    if ((byte)value != '\0') {
      for (uVar37 = 0; uVar37 <= pAVar30->operating_points_cnt_minus_1; uVar37 = uVar37 + 1) {
        if ((pAVar30->decoder_model_present_for_this_op[uVar37] != '\0') &&
           ((pAVar30->operating_point_idc[uVar37] == 0 ||
            (((1 << ((char)ctx->spatial_id + 8U & 0x1f) | 1 << ((byte)ctx->temporal_id & 0x1f)) &
             ~(uint)pAVar30->operating_point_idc[uVar37]) == 0)))) {
          iVar32 = (pAVar30->decoder_model_info).buffer_removal_time_length_minus_1 + 1;
          RVar13 = mpp_av1_read_unsigned
                             (&local_90->gb,iVar32,"buffer_removal_time[i]",&value,0,
                              ~(uint)(-1L << ((byte)iVar32 & 0x3f)));
          if (RVar13 < 0) {
            return -1;
          }
          local_98->buffer_removal_time[uVar37] = value;
          pAVar30 = local_80;
        }
      }
    }
  }
  pAVar42 = local_98;
  if ((*local_58 == 3) || ((*local_58 == 0 && (local_98->show_frame != '\0')))) {
    local_98->refresh_frame_flags = 0xff;
    RVar9 = 0xff;
  }
  else {
    RVar13 = mpp_av1_read_unsigned(&local_90->gb,8,"refresh_frame_flags",&value,0,0xff);
    if (RVar13 < 0) {
      return -1;
    }
    pAVar42->refresh_frame_flags = (byte)value;
    pAVar30 = local_80;
    RVar9 = (byte)value;
  }
  ctx->refresh_frame_flags = RVar9;
  if (((local_81 & RVar9 == 0xff) == 0) && (pAVar30->enable_order_hint != '\0')) {
    pRVar34 = &ctx->ref_s[0].order_hint;
    for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
      if (local_98->error_resilient_mode == '\0') {
        uVar14 = *pRVar34;
        local_98->ref_order_hint[lVar18] = (RK_U8)uVar14;
      }
      else {
        RVar13 = mpp_av1_read_unsigned
                           (&local_90->gb,RVar12,"ref_order_hint[i]",&value,0,
                            ~(uint)(-1L << ((byte)RVar12 & 0x3f)));
        if (RVar13 < 0) {
          return -1;
        }
        local_98->ref_order_hint[lVar18] = (RK_U8)value;
        pAVar30 = local_80;
        uVar14 = value;
      }
      if (*pRVar34 != (uVar14 & 0xff)) {
        ((AV1ReferenceFrameState *)(pRVar34 + -0xb))->valid = 0;
      }
      pRVar34 = pRVar34 + 0x3f;
    }
  }
  pAVar28 = local_90;
  pAVar42 = local_98;
  local_98->ref_frame_valued = '\x01';
  if ((local_98->frame_type & 0xfd) == 0) {
    RVar12 = mpp_av1_frame_size(ctx,&local_90->gb,local_98);
    if (RVar12 < 0) {
      return RVar12;
    }
    RVar12 = mpp_av1_render_size(ctx,&pAVar28->gb,pAVar42);
    if (RVar12 < 0) {
      return -1;
    }
    pRVar38 = &pAVar42->ref_frame_valued;
    if ((pAVar42->allow_screen_content_tools == '\0') || (ctx->upscaled_width != ctx->frame_width))
    {
      local_98->allow_intrabc = '\0';
    }
    else {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"allow_intrabc",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->allow_intrabc = (byte)value;
    }
  }
  else {
    if (pAVar30->enable_order_hint == '\0') {
      local_98->frame_refs_short_signaling = '\0';
    }
    else {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"frame_refs_short_signaling",&value,0,1);
      pAVar28 = local_90;
      if (RVar12 < 0) {
        return -1;
      }
      pAVar42->frame_refs_short_signaling = (byte)value;
      pAVar30 = local_80;
      if ((byte)value != '\0') {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,3,"last_frame_idx",&value,0,7);
        if (RVar12 < 0) {
          return -1;
        }
        pAVar42->last_frame_idx = (byte)value;
        RVar12 = mpp_av1_read_unsigned(&pAVar28->gb,3,"golden_frame_idx",&value,0,7);
        pAVar30 = local_80;
        if (RVar12 < 0) {
          return -1;
        }
        uVar14 = value & 0xff;
        pAVar42->golden_frame_idx = (RK_U8)value;
        seq = ctx->sequence_header;
        for (lVar18 = 0; lVar18 != 7; lVar18 = lVar18 + 1) {
          ref_frame_idx[lVar18] = -1;
        }
        local_68 = (RK_S16 (*) [8])(ulong)pAVar42->last_frame_idx;
        ref_frame_idx[0] = pAVar42->last_frame_idx;
        ref_frame_idx[3] = (RK_U8)value;
        for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
          *(undefined1 *)((long)&value + lVar18) = 0;
        }
        *(undefined1 *)((long)&value + (long)local_68) = 1;
        local_78 = (AV1RawSequenceHeader *)(ulong)uVar14;
        *(undefined1 *)((long)&value + (ulong)uVar14) = 1;
        iVar32 = 1 << (seq->order_hint_bits_minus_1 & 0x1f);
        RVar16 = ctx->order_hint;
        pRVar34 = &ctx->ref_s[0].order_hint;
        for (lVar18 = 0; pAVar42 = local_98, lVar18 != 8; lVar18 = lVar18 + 1) {
          RVar12 = mpp_av1_get_relative_dist(seq,*pRVar34,RVar16);
          acStack_48[lVar18] = (char)RVar12 + (char)iVar32;
          pRVar34 = pRVar34 + 0x3f;
          pAVar30 = local_80;
        }
        iVar25 = (int)acStack_48[(long)local_68];
        iVar39 = (int)acStack_48[(long)local_78];
        uVar37 = 0xffffffffffffffff;
        for (uVar40 = 0; uVar40 != 8; uVar40 = uVar40 + 1) {
          if (((*(char *)((long)&value + uVar40) == '\0') &&
              (iVar27 = (int)acStack_48[uVar40], iVar32 <= iVar27)) &&
             ((int)uVar37 < 0 || iVar25 <= iVar27)) {
            uVar37 = uVar40 & 0xffffffff;
            iVar25 = iVar27;
          }
        }
        if (-1 < (int)uVar37) {
          ref_frame_idx[6] = (RK_S8)uVar37;
          *(undefined1 *)((long)&value + (uVar37 & 0xffffffff)) = 1;
        }
        uVar37 = 0xffffffffffffffff;
        for (uVar40 = 0; uVar40 != 8; uVar40 = uVar40 + 1) {
          if (((*(char *)((long)&value + uVar40) == '\0') &&
              (iVar27 = (int)acStack_48[uVar40], iVar32 <= iVar27)) &&
             (iVar27 < iVar39 || (int)uVar37 < 0)) {
            uVar37 = uVar40 & 0xffffffff;
            iVar39 = iVar27;
          }
        }
        if (-1 < (int)uVar37) {
          ref_frame_idx[4] = (RK_S8)uVar37;
          *(undefined1 *)((long)&value + (uVar37 & 0xffffffff)) = 1;
        }
        uVar37 = 0xffffffffffffffff;
        for (uVar40 = 0; uVar40 != 8; uVar40 = uVar40 + 1) {
          if (((*(char *)((long)&value + uVar40) == '\0') &&
              (iVar27 = (int)acStack_48[uVar40], iVar32 <= iVar27)) &&
             (iVar27 < iVar39 || (int)uVar37 < 0)) {
            uVar37 = uVar40 & 0xffffffff;
            iVar39 = iVar27;
          }
        }
        if (-1 < (int)uVar37) {
          ref_frame_idx[5] = (RK_S8)uVar37;
          *(undefined1 *)((long)&value + (uVar37 & 0xffffffff)) = 1;
        }
        for (lVar18 = 0; lVar18 != 5; lVar18 = lVar18 + 1) {
          if (ref_frame_idx[(ulong)(byte)(&mpp_av1_set_frame_refs_ref_frame_list)[lVar18] - 1] <
              '\0') {
            uVar37 = 0xffffffff;
            for (uVar40 = 0; uVar40 != 8; uVar40 = uVar40 + 1) {
              if (((*(char *)((long)&value + uVar40) == '\0') &&
                  (iVar27 = (int)acStack_48[uVar40], pAVar42 = local_98, iVar27 < iVar32)) &&
                 ((int)uVar37 < 0 || iVar25 <= iVar27)) {
                uVar37 = uVar40 & 0xffffffff;
                iVar25 = iVar27;
              }
            }
            pAVar30 = local_80;
            if (-1 < (int)uVar37) {
              ref_frame_idx[(ulong)(byte)(&mpp_av1_set_frame_refs_ref_frame_list)[lVar18] - 1] =
                   (RK_S8)uVar37;
              *(undefined1 *)((long)&value + uVar37) = 1;
              pAVar30 = local_80;
            }
          }
        }
        uVar37 = 0xffffffffffffffff;
        for (uVar40 = 0; uVar40 != 8; uVar40 = uVar40 + 1) {
          iVar32 = (int)acStack_48[uVar40];
          uVar31 = uVar40;
          if (iVar39 <= acStack_48[uVar40] && -1 < (int)uVar37) {
            iVar32 = iVar39;
            uVar31 = uVar37;
          }
          iVar39 = iVar32;
          uVar37 = uVar31 & 0xffffffff;
        }
        for (lVar18 = 0; lVar18 != 7; lVar18 = lVar18 + 1) {
          cVar23 = ref_frame_idx[lVar18];
          if (ref_frame_idx[lVar18] < '\0') {
            cVar23 = (char)uVar37;
          }
          ref_frame_idx[lVar18] = cVar23;
          pAVar42->ref_frame_idx[lVar18] = cVar23;
        }
      }
    }
    lVar18 = -7;
    while( true ) {
      pAVar28 = local_90;
      if (lVar18 == 0) break;
      if (pAVar42->frame_refs_short_signaling == '\0') {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,3,"ref_frame_idx[i]",&value,0,7);
        if (RVar12 < 0) {
          return -1;
        }
        *(byte *)((long)pAVar42->delta_frame_id_minus1 + lVar18 + -2) = (byte)value;
        pAVar30 = local_80;
      }
      if (pAVar30->frame_id_numbers_present_flag != '\0') {
        iVar32 = pAVar30->delta_frame_id_length_minus_2 + 2;
        RVar12 = mpp_av1_read_unsigned
                           (&local_90->gb,iVar32,"delta_frame_id_minus1[i]",&value,0,
                            ~(uint)(-1L << ((byte)iVar32 & 0x3f)));
        if (RVar12 < 0) {
          return -1;
        }
        pAVar42->delta_frame_id_minus1[lVar18 + 7] = value;
        pAVar30 = local_80;
      }
      lVar18 = lVar18 + 1;
    }
    if ((pAVar42->frame_size_override_flag == '\0') || (pAVar42->error_resilient_mode != '\0')) {
      RVar12 = mpp_av1_frame_size(ctx,&local_90->gb,pAVar42);
      if (RVar12 < 0) {
        return RVar12;
      }
      RVar12 = mpp_av1_render_size(ctx,&pAVar28->gb,pAVar42);
      if (RVar12 < 0) {
        return RVar12;
      }
    }
    else {
      uVar37 = 0;
      while( true ) {
        pAVar28 = local_90;
        if (uVar37 == 7) break;
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"found_ref[i]",&value,0,1);
        if (RVar12 < 0) {
          return -1;
        }
        pAVar42->found_ref[uVar37] = (byte)value;
        if ((byte)value != '\0') {
          cVar23 = pAVar42->ref_frame_idx[uVar37];
          if (ctx->ref_s[cVar23].valid == 0) {
            _mpp_log_l(2,"av1d_cbs",
                       "Missing reference frame needed for frame size (ref = %d, ref_frame_idx = %d).\n"
                       ,"mpp_av1_frame_size_with_refs",uVar37 & 0xffffffff);
            return -0x3ef;
          }
          RVar12 = ctx->ref_s[cVar23].upscaled_width;
          pAVar42->frame_width_minus_1 = (short)RVar12 - 1;
          RVar13 = ctx->ref_s[cVar23].frame_height;
          pAVar42->frame_height_minus_1 = (short)RVar13 - 1;
          RVar11 = ctx->ref_s[cVar23].render_width;
          pAVar42->render_width_minus_1 = (short)RVar11 - 1;
          RVar5 = ctx->ref_s[cVar23].render_height;
          pAVar42->render_height_minus_1 = (short)RVar5 - 1;
          ctx->upscaled_width = RVar12;
          ctx->frame_width = RVar12;
          ctx->frame_height = RVar13;
          ctx->render_width = RVar11;
          ctx->render_height = RVar5;
          iVar32 = mpp_av1_superres_params(ctx,&local_90->gb,pAVar42);
          goto LAB_001bada0;
        }
        uVar37 = uVar37 + 1;
      }
      RVar12 = mpp_av1_frame_size(ctx,&local_90->gb,pAVar42);
      if (RVar12 < 0) {
        return RVar12;
      }
      iVar32 = mpp_av1_render_size(ctx,&pAVar28->gb,pAVar42);
LAB_001bada0:
      if (iVar32 < 0) {
        return -1;
      }
    }
    if (pAVar42->force_integer_mv == '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"allow_high_precision_mv",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      pAVar42->allow_high_precision_mv = (byte)value;
    }
    else {
      pAVar42->allow_high_precision_mv = '\0';
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"is_filter_switchable",&value,0,1);
    if (RVar12 < 0) {
      return RVar12;
    }
    pAVar42->is_filter_switchable = (byte)value;
    if ((byte)value == '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"interpolation_filter",&value,0,3);
      if (RVar12 < 0) {
        return -1;
      }
      pAVar42->interpolation_filter = (byte)value;
    }
    else {
      pAVar42->interpolation_filter = '\x04';
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"is_motion_mode_switchable",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    pAVar42->is_motion_mode_switchable = (byte)value;
    if ((pAVar42->error_resilient_mode == '\0') && (local_80->enable_ref_frame_mvs != '\0')) {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"use_ref_frame_mvs",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      pAVar42->use_ref_frame_mvs = (byte)value;
    }
    else {
      pAVar42->use_ref_frame_mvs = '\0';
    }
    pRVar38 = &pAVar42->allow_intrabc;
  }
  pAVar42 = local_98;
  *pRVar38 = '\0';
  if ((local_80->reduced_still_picture_header == '\0') && (local_98->disable_cdf_update == '\0')) {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"disable_frame_end_update_cdf",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    pAVar42->disable_frame_end_update_cdf = (byte)value;
    RVar9 = (byte)value;
  }
  else {
    local_98->disable_frame_end_update_cdf = '\x01';
    RVar9 = '\x01';
  }
  ctx->disable_frame_end_update_cdf = RVar9;
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","ptile_info in %d","mpp_av1_uncompressed_header");
  }
  uVar36 = ctx->frame_width + 7 >> 2 & 0xfffffffe;
  uVar33 = ctx->frame_height + 7 >> 2 & 0xfffffffe;
  bVar41 = ctx->sequence_header->use_128x128_superblock == '\0';
  uVar14 = (int)(uVar36 + 0xf) >> 4;
  if (!bVar41) {
    uVar14 = (int)(uVar36 + 0x1f) >> 5;
  }
  uVar36 = (int)(uVar33 + 0xf) >> 4;
  if (!bVar41) {
    uVar36 = (int)(uVar33 + 0x1f) >> 5;
  }
  blksize = 0x1000 >> (bVar41 ^ 7U);
  local_70._0_4_ = 0x900000 >> (bVar41 ^ 7U) * '\x02';
  uVar15 = mpp_av1_tile_log2(blksize,uVar14);
  uVar33 = 0x40;
  if ((int)uVar14 < 0x40) {
    uVar33 = uVar14;
  }
  RVar16 = mpp_av1_tile_log2(1,uVar33);
  uVar33 = 0x40;
  if ((int)uVar36 < 0x40) {
    uVar33 = uVar36;
  }
  RVar12 = mpp_av1_tile_log2(1,uVar33);
  local_40 = CONCAT44(local_40._4_4_,RVar12);
  local_38 = (AV1ReferenceFrameState *)CONCAT44(local_38._4_4_,uVar36 * uVar14);
  local_78 = (AV1RawSequenceHeader *)(ulong)uVar14;
  local_68 = (RK_S16 (*) [8])(ulong)uVar36;
  uVar14 = mpp_av1_tile_log2((uint)local_70,uVar36 * uVar14);
  local_70 = (RK_U8 (*) [8])CONCAT44(local_70._4_4_,uVar15);
  if ((int)uVar14 < (int)uVar15) {
    uVar14 = uVar15;
  }
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"uniform_tile_spacing_flag",&value,0,1);
  pAVar28 = local_90;
  pAVar42 = local_98;
  if (RVar12 < 0) {
    return RVar12;
  }
  local_98->uniform_tile_spacing_flag = (byte)value;
  if ((byte)value == '\0') {
    uVar33 = 0;
    iVar32 = 0;
    local_70 = (RK_U8 (*) [8])(ulong)uVar14;
    for (uVar37 = 0;
        (RVar16 = (int)local_78 - iVar32, RVar16 != 0 && iVar32 <= (int)local_78 && (uVar37 < 0x40))
        ; uVar37 = uVar37 + 1) {
      if ((int)blksize <= (int)RVar16) {
        RVar16 = blksize;
      }
      RVar12 = mpp_av1_read_ns(&local_90->gb,"width_in_sbs_minus_1[i]",RVar16,&value);
      if (RVar12 < 0) {
        return RVar12;
      }
      local_98->width_in_sbs_minus_1[uVar37] = (RK_U8)value;
      uVar14 = (value & 0xff) + 1;
      if (uVar33 < uVar14) {
        uVar33 = uVar14;
      }
      iVar32 = iVar32 + (value & 0xff) + 1;
    }
    RVar12 = mpp_av1_tile_log2(1,(RK_S32)uVar37);
    local_98->tile_cols_log2 = (RK_U8)RVar12;
    uVar31 = 0;
    uVar40 = (ulong)((int)local_70 + 1U & 0xff);
    if ((int)local_70 < 1) {
      uVar40 = uVar31;
    }
    local_98->tile_cols = (RK_U16)uVar37;
    RVar26 = ((int)local_38 >> ((byte)uVar40 & 0x1f)) / (int)uVar33;
    RVar16 = 1;
    if (1 < (int)RVar26) {
      RVar16 = RVar26;
    }
    iVar32 = 0;
    for (; (RVar26 = (int)local_68 - iVar32, RVar26 != 0 && iVar32 <= (int)local_68 &&
           (uVar31 < 0x40)); uVar31 = uVar31 + 1) {
      if ((int)RVar16 <= (int)RVar26) {
        RVar26 = RVar16;
      }
      RVar12 = mpp_av1_read_ns(&local_90->gb,"height_in_sbs_minus_1[i]",RVar26,&value);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->height_in_sbs_minus_1[uVar31] = (RK_U8)value;
      iVar32 = iVar32 + (value & 0xff) + 1;
    }
    RVar12 = mpp_av1_tile_log2(1,(RK_S32)uVar31);
    bVar20 = (byte)RVar12;
    local_98->tile_rows_log2 = bVar20;
    local_98->tile_rows = (RK_U16)uVar31;
    pAVar42 = local_98;
  }
  else {
    RVar12 = mpp_av1_read_increment(&local_90->gb,(uint)local_70,RVar16,"tile_cols_log2",&value);
    if (RVar12 < 0) {
      return RVar12;
    }
    bVar20 = (byte)value;
    iVar32 = (1 << (bVar20 & 0x1f)) + (int)local_78 + -1 >> (bVar20 & 0x1f);
    pAVar42->tile_cols_log2 = bVar20;
    pAVar42->tile_cols = (RK_U16)((iVar32 + (int)local_78 + -1) / iVar32);
    RVar26 = uVar14 - (value & 0xff);
    RVar16 = 0;
    if (0 < (int)RVar26) {
      RVar16 = RVar26;
    }
    RVar12 = mpp_av1_read_increment(&pAVar28->gb,RVar16,(RK_U32)local_40,"tile_rows_log2",&value);
    if (RVar12 < 0) {
      return -1;
    }
    pAVar42->tile_rows_log2 = (byte)value;
    iVar25 = (int)local_68 + (1 << ((byte)value & 0x1f)) + -1 >> ((byte)value & 0x1f);
    pAVar42->tile_rows = (RK_U16)(((int)local_68 + iVar25 + -1) / iVar25);
    for (lVar18 = 0; lVar29 = (ulong)pAVar42->tile_cols - 1, lVar18 < lVar29; lVar18 = lVar18 + 1) {
      pAVar42->width_in_sbs_minus_1[lVar18] = (char)iVar32 + 0xff;
    }
    pAVar42->width_in_sbs_minus_1[lVar18] = (char)local_78 + ~((char)lVar29 * (char)iVar32);
    for (lVar18 = 0; lVar29 = (ulong)pAVar42->tile_rows - 1, lVar18 < lVar29; lVar18 = lVar18 + 1) {
      pAVar42->height_in_sbs_minus_1[lVar18] = (char)iVar25 + 0xff;
    }
    pAVar42->height_in_sbs_minus_1[lVar18] = (char)local_68 + ~((char)lVar29 * (char)iVar25);
    bVar20 = (byte)value;
  }
  pAVar28 = local_90;
  if (pAVar42->tile_cols_log2 == 0 && bVar20 == 0) {
    pAVar42->context_update_tile_id = 0;
    pAVar42->tile_size_bytes_minus1 = '\x03';
  }
  else {
    iVar32 = (uint)pAVar42->tile_cols_log2 + (uint)bVar20;
    RVar12 = mpp_av1_read_unsigned
                       (&local_90->gb,iVar32,"context_update_tile_id",&value,0,
                        ~(uint)(-1L << ((byte)iVar32 & 0x3f)));
    if (RVar12 < 0) {
      return -1;
    }
    pAVar42->context_update_tile_id = (RK_U16)value;
    RVar12 = mpp_av1_read_unsigned(&pAVar28->gb,2,"tile_size_bytes_minus1",&value,0,3);
    if (RVar12 < 0) {
      return -1;
    }
    pAVar42->tile_size_bytes_minus1 = (byte)value;
  }
  uVar4._0_2_ = pAVar42->tile_cols;
  uVar4._2_2_ = pAVar42->tile_rows;
  uVar6 = CONCAT24(uVar4._2_2_,uVar4);
  ctx->tile_cols = (int)(ulong)(uVar6 & 0xffff0000ffff);
  ctx->tile_rows = (int)((ulong)(uVar6 & 0xffff0000ffff) >> 0x20);
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","ptile_info out %d","mpp_av1_uncompressed_header");
  }
  pAVar28 = local_90;
  pAVar30 = ctx->sequence_header;
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"base_q_idx",&value,0,0xff);
  if (RVar12 < 0) {
    return RVar12;
  }
  pAVar42->base_q_idx = (byte)value;
  RVar12 = mpp_av1_read_unsigned(&pAVar28->gb,1,"delta_q_y_dc.delta_coded",&value,0,1);
  if (RVar12 < 0) {
    return -1;
  }
  if ((byte)value == '\0') {
    RVar10 = '\0';
  }
  else {
    RVar12 = mpp_av1_read_signed(&local_90->gb,7,"delta_q_y_dc.delta_q",(RK_S32 *)&value,-0x40,0x3f)
    ;
    if (RVar12 < 0) {
      return -1;
    }
    RVar10 = (byte)value;
  }
  pAVar42->delta_q_y_dc = RVar10;
  if (ctx->num_planes < 2) {
    pAVar42->delta_q_u_dc = '\0';
    pAVar42->delta_q_u_ac = '\0';
    pAVar42->delta_q_v_dc = '\0';
    pAVar42->delta_q_v_ac = '\0';
  }
  else {
    if ((pAVar30->color_config).separate_uv_delta_q == '\0') {
      pAVar42->diff_uv_delta = '\0';
    }
    else {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"diff_uv_delta",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      pAVar42->diff_uv_delta = (byte)value;
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"delta_q_u_dc.delta_coded",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    if ((byte)value == '\0') {
      RVar10 = '\0';
    }
    else {
      RVar12 = mpp_av1_read_signed(&local_90->gb,7,"delta_q_u_dc.delta_q",(RK_S32 *)&value,-0x40,
                                   0x3f);
      if (RVar12 < 0) {
        return -1;
      }
      RVar10 = (byte)value;
    }
    local_98->delta_q_u_dc = RVar10;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"delta_q_u_ac.delta_coded",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    if ((byte)value == '\0') {
      RVar10 = '\0';
    }
    else {
      RVar12 = mpp_av1_read_signed(&local_90->gb,7,"delta_q_u_ac.delta_q",(RK_S32 *)&value,-0x40,
                                   0x3f);
      if (RVar12 < 0) {
        return -1;
      }
      RVar10 = (byte)value;
    }
    local_98->delta_q_u_ac = RVar10;
    if (local_98->diff_uv_delta == '\0') {
      local_98->delta_q_v_dc = local_98->delta_q_u_dc;
    }
    else {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"delta_q_v_dc.delta_coded",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      if ((byte)value == '\0') {
        RVar10 = '\0';
      }
      else {
        RVar12 = mpp_av1_read_signed(&local_90->gb,7,"delta_q_v_dc.delta_q",(RK_S32 *)&value,-0x40,
                                     0x3f);
        if (RVar12 < 0) {
          return -1;
        }
        RVar10 = (byte)value;
      }
      local_98->delta_q_v_dc = RVar10;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"delta_q_v_ac.delta_coded",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      if ((byte)value == '\0') {
        RVar10 = '\0';
      }
      else {
        RVar12 = mpp_av1_read_signed(&local_90->gb,7,"delta_q_v_ac.delta_q",(RK_S32 *)&value,-0x40,
                                     0x3f);
        if (RVar12 < 0) {
          return -1;
        }
        RVar10 = (byte)value;
      }
    }
    local_98->delta_q_v_ac = RVar10;
    pAVar42 = local_98;
  }
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"using_qmatrix",&value,0,1);
  pAVar28 = local_90;
  if (RVar12 < 0) {
    return -1;
  }
  pAVar42->using_qmatrix = (byte)value;
  if ((byte)value != '\0') {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,4,"qm_y",&value,0,0xf);
    if (RVar12 < 0) {
      return -1;
    }
    pAVar42->qm_y = (byte)value;
    RVar12 = mpp_av1_read_unsigned(&pAVar28->gb,4,"qm_u",&value,0,0xf);
    if (RVar12 < 0) {
      return -1;
    }
    local_98->qm_u = (byte)value;
    if ((pAVar30->color_config).separate_uv_delta_q != '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,4,"qm_v",&value,0,0xf);
      if (RVar12 < 0) {
        return -1;
      }
    }
    local_98->qm_v = (byte)value;
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","quantization out %d","mpp_av1_uncompressed_header");
  }
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"segmentation_enabled",&value,0,1);
  if (RVar12 < 0) {
    return RVar12;
  }
  local_98->segmentation_enabled = (byte)value;
  if ((byte)value == '\0') {
    paRVar19 = local_98->feature_enabled;
    paRVar22 = local_98->feature_value;
    for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
      for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
        (*paRVar19)[lVar29] = '\0';
        (*paRVar22)[lVar29] = 0;
      }
      paRVar22 = paRVar22 + 1;
      paRVar19 = paRVar19 + 1;
    }
  }
  else {
    if (local_98->primary_ref_frame == '\a') {
      local_98->segmentation_update_map = '\x01';
      local_98->segmentation_temporal_update = '\0';
      local_98->segmentation_update_data = '\x01';
    }
    else {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"segmentation_update_map",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->segmentation_update_map = (byte)value;
      if ((byte)value == '\0') {
        local_98->segmentation_temporal_update = '\0';
      }
      else {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"segmentation_temporal_update",&value,0,1);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->segmentation_temporal_update = (byte)value;
      }
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"segmentation_update_data",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->segmentation_update_data = (byte)value;
    }
    local_70 = local_98->feature_enabled;
    local_50 = local_98->feature_value;
    local_38 = ctx->ref_s;
    for (local_40 = 0; local_40 != 8; local_40 = local_40 + 1) {
      local_78 = (AV1RawSequenceHeader *)&mpp_av1_segmentation_params_default_feature_enabled;
      local_68 = (RK_S16 (*) [8])mpp_av1_segmentation_params_default_feature_value;
      if ((ulong)local_98->primary_ref_frame != 7) {
        local_78 = (AV1RawSequenceHeader *)
                   (local_38[local_98->ref_frame_idx[local_98->primary_ref_frame]].feature_enabled +
                   local_40);
        local_68 = local_38[local_98->ref_frame_idx[local_98->primary_ref_frame]].feature_value +
                   local_40;
      }
      pAVar28 = local_90;
      pAVar42 = local_98;
      paRVar19 = local_70;
      for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
        if (pAVar42->segmentation_update_data == '\0') {
          (*paRVar19)[lVar18] = *(RK_U8 *)((long)local_78->operating_point_idc + lVar18 + -0x24);
          (*local_50)[lVar18] = (*local_68)[lVar18];
        }
        else {
          RVar12 = mpp_av1_read_unsigned(&pAVar28->gb,1,"feature_enabled[i][j]",&value,0,1);
          if (RVar12 < 0) {
            return -1;
          }
          (*paRVar19)[lVar18] = (byte)value;
          if (((byte)value == '\0') || ((~(uint)lVar18 & 6) == 0)) {
            (*local_50)[lVar18] = 0;
            pAVar28 = local_90;
          }
          else if (lVar18 - 5U < 3) {
            RVar12 = mpp_av1_read_unsigned
                               (&local_90->gb,
                                (uint)(byte)(&mpp_av1_segmentation_params_bits)[lVar18],
                                "feature_value[i][j]",&value,0,
                                ~(uint)(-1L << ((&mpp_av1_segmentation_params_bits)[lVar18] & 0x3f))
                               );
            if (RVar12 < 0) {
              return -1;
            }
            (*local_50)[lVar18] = (RK_U16)value;
            pAVar28 = local_90;
          }
          else {
            MVar17 = mpp_read_bits(&local_90->gb,1,(RK_S32 *)&value);
            pAVar28 = local_90;
            RVar16 = value;
            (local_90->gb).ret = MVar17;
            if (MVar17 != MPP_OK) {
              return -0x3ec;
            }
            bVar20 = (&mpp_av1_segmentation_params_bits)[lVar18];
            MVar17 = mpp_read_bits(&local_90->gb,(uint)bVar20,(RK_S32 *)&value);
            (pAVar28->gb).ret = MVar17;
            if (MVar17 != MPP_OK) {
              return -0x3ec;
            }
            sVar24 = (short)(-1 << (bVar20 & 0x1f));
            if (RVar16 == 0) {
              sVar24 = 0;
            }
            (*local_50)[lVar18] = sVar24 + (short)value;
            pAVar28 = local_90;
            pAVar42 = local_98;
            paRVar19 = local_70;
          }
        }
      }
      local_50 = local_50 + 1;
      local_70 = paRVar19 + 1;
    }
  }
  local_98->segmentation_id_last_active = '\0';
  local_98->segmentation_id_preskip = '\0';
  paRVar19 = local_98->feature_enabled;
  for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
    for (uVar37 = 0; uVar37 != 8; uVar37 = uVar37 + 1) {
      if (((*paRVar19)[uVar37] != '\0') &&
         (local_98->segmentation_id_last_active = (RK_U8)lVar18, 5 < uVar37)) {
        local_98->segmentation_id_preskip = '\x01';
      }
    }
    paRVar19 = paRVar19 + 1;
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","segmentation out %d","mpp_av1_uncompressed_header");
  }
  if (local_98->base_q_idx == '\0') {
    local_98->delta_q_present = '\0';
  }
  else {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"delta_q_present",&value,0,1);
    if (RVar12 < 0) {
      return RVar12;
    }
    local_98->delta_q_present = (byte)value;
    if ((byte)value != '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"delta_q_res",&value,0,3);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->delta_q_res = (byte)value;
    }
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","delta_q out %d","mpp_av1_uncompressed_header");
  }
  if (local_98->delta_q_present == '\0') {
    local_98->delta_lf_present = '\0';
    local_98->delta_lf_res = '\0';
    local_98->delta_lf_multi = '\0';
  }
  else {
    if (local_98->allow_intrabc == '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"delta_lf_present",&value,0,1);
      if (RVar12 < 0) {
        return RVar12;
      }
      local_98->delta_lf_present = (byte)value;
      if ((byte)value != '\0') {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"delta_lf_res",&value,0,3);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->delta_lf_res = (byte)value;
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"delta_lf_multi",&value,0,1);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->delta_lf_multi = (byte)value;
        goto LAB_001bb727;
      }
    }
    else {
      local_98->delta_lf_present = '\0';
    }
    local_98->delta_lf_res = '\0';
    local_98->delta_lf_multi = '\0';
  }
LAB_001bb727:
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","lf out %d","mpp_av1_uncompressed_header");
  }
  if ((local_98->error_resilient_mode == '\0' && local_81 == 0) &&
     ((ulong)local_98->primary_ref_frame != 7)) {
    Av1GetCDFs(ctx,(int)local_98->ref_frame_idx[local_98->primary_ref_frame]);
  }
  else {
    ctx->cdfs = &ctx->default_cdfs;
    ctx->cdfs_ndvc = &ctx->default_cdfs_ndvc;
    Av1DefaultCoeffProbs((uint)local_98->base_q_idx,&ctx->default_cdfs);
  }
  if ((av1d_debug & 2) != 0) {
    _mpp_log_l(4,"av1d_cbs",
               "show_existing_frame_index %d primary_ref_frame %d %d (%d) refresh_frame_flags %d base_q_idx %d\n"
               ,"mpp_av1_uncompressed_header",(ulong)local_98->frame_to_show_map_idx,
               (long)local_98->ref_frame_idx[local_98->primary_ref_frame],
               (ulong)(uint)ctx->ref[local_98->ref_frame_idx[local_98->primary_ref_frame]].
                            slot_index,(ulong)local_98->primary_ref_frame,
               (ulong)local_98->refresh_frame_flags,(ulong)local_98->base_q_idx);
  }
  pAVar42 = local_98;
  Av1StoreCDFs(ctx,(uint)local_98->refresh_frame_flags);
  ctx->coded_lossless = 1;
  bVar20 = pAVar42->base_q_idx;
  iVar32 = 1;
  for (lVar18 = 0xe3; lVar18 != 0x123; lVar18 = lVar18 + 8) {
    uVar14 = (uint)bVar20;
    if (pAVar42->found_ref[lVar18 + -8] != '\0') {
      uVar14 = (int)*(short *)((long)pAVar42->buffer_removal_time + lVar18 * 2 + -0x1c) + uVar14;
    }
    if (((((0 < (int)uVar14) || (pAVar42->delta_q_y_dc != '\0')) || (pAVar42->delta_q_u_ac != '\0'))
        || ((pAVar42->delta_q_u_dc != '\0' || (pAVar42->delta_q_v_ac != '\0')))) ||
       (pAVar42->delta_q_v_dc != '\0')) {
      ctx->coded_lossless = 0;
      iVar32 = 0;
    }
  }
  if (iVar32 == 0) {
    uVar14 = 0;
  }
  else {
    uVar14 = (uint)(ctx->frame_width == ctx->upscaled_width);
  }
  ctx->all_lossless = uVar14;
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","filter in %d","mpp_av1_uncompressed_header");
    iVar32 = ctx->coded_lossless;
  }
  if ((iVar32 == 0) && (local_98->allow_intrabc == '\0')) {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,6,"loop_filter_level[0]",&value,0,0x3f);
    if (RVar12 < 0) {
      return RVar12;
    }
    local_98->loop_filter_level[0] = (byte)value;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,6,"loop_filter_level[1]",&value,0,0x3f);
    if (RVar12 < 0) {
      return -1;
    }
    local_98->loop_filter_level[1] = (byte)value;
    if ((1 < ctx->num_planes) && ((byte)value != '\0' || local_98->loop_filter_level[0] != '\0')) {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,6,"loop_filter_level[2]",&value,0,0x3f);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->loop_filter_level[2] = (byte)value;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,6,"loop_filter_level[3]",&value,0,0x3f);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->loop_filter_level[3] = (byte)value;
    }
    if ((av1d_debug & 2) != 0) {
      _mpp_log_l(4,"av1d_cbs","orderhint %d loop_filter_level %d %d %d %d\n",
                 "mpp_av1_loop_filter_params",(ulong)local_98->order_hint,
                 (ulong)local_98->loop_filter_level[0],(ulong)local_98->loop_filter_level[1],
                 (ulong)local_98->loop_filter_level[2],(ulong)local_98->loop_filter_level[3]);
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,3,"loop_filter_sharpness",&value,0,7);
    if (RVar12 < 0) {
      return -1;
    }
    local_98->loop_filter_sharpness = (byte)value;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"loop_filter_delta_enabled",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    local_98->loop_filter_delta_enabled = (byte)value;
    if ((byte)value == '\0') {
      for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
        local_98->loop_filter_ref_deltas[lVar18] =
             (&mpp_av1_loop_filter_params_default_loop_filter_ref_deltas)[lVar18];
      }
      goto LAB_001bba11;
    }
    if ((ulong)local_98->primary_ref_frame == 7) {
      pRVar35 = "\x01";
      local_78 = (AV1RawSequenceHeader *)&mpp_av1_loop_filter_params_default_loop_filter_mode_deltas
      ;
    }
    else {
      pRVar35 = ctx->ref_s[local_98->ref_frame_idx[local_98->primary_ref_frame]].
                loop_filter_ref_deltas;
      local_78 = (AV1RawSequenceHeader *)
                 ctx->ref_s[local_98->ref_frame_idx[local_98->primary_ref_frame]].
                 loop_filter_mode_deltas;
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"loop_filter_delta_update",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    local_98->loop_filter_delta_update = (byte)value;
    for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
      if (local_98->loop_filter_delta_update == '\0') {
        local_98->update_ref_delta[lVar18] = '\0';
LAB_001bc989:
        RVar10 = pRVar35[lVar18];
      }
      else {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"update_ref_delta[i]",&value,0,1);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->update_ref_delta[lVar18] = (byte)value;
        if ((byte)value == '\0') goto LAB_001bc989;
        RVar12 = mpp_av1_read_signed(&local_90->gb,7,"loop_filter_ref_deltas[i]",(RK_S32 *)&value,
                                     -0x40,0x3f);
        if (RVar12 < 0) {
          return -1;
        }
        RVar10 = (byte)value;
      }
      local_98->loop_filter_ref_deltas[lVar18] = RVar10;
    }
    for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
      if (local_98->loop_filter_delta_update == '\0') {
        local_98->update_mode_delta[lVar18] = '\0';
LAB_001bcb4c:
        RVar10 = *(RK_S8 *)((long)local_78->operating_point_idc + lVar18 + -0x24);
      }
      else {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"update_mode_delta[i]",&value,0,1);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->update_mode_delta[lVar18] = (byte)value;
        if ((byte)value == '\0') goto LAB_001bcb4c;
        RVar12 = mpp_av1_read_signed(&local_90->gb,7,"loop_filter_mode_deltas[i]",(RK_S32 *)&value,
                                     -0x40,0x3f);
        if (RVar12 < 0) {
          return -1;
        }
        RVar10 = (byte)value;
      }
      local_98->loop_filter_mode_deltas[lVar18] = RVar10;
    }
  }
  else {
    local_98->loop_filter_level[0] = '\0';
    local_98->loop_filter_level[1] = '\0';
    local_98->loop_filter_ref_deltas[0] = '\x01';
    local_98->loop_filter_ref_deltas[1] = '\0';
    local_98->loop_filter_ref_deltas[2] = '\0';
    local_98->loop_filter_ref_deltas[3] = '\0';
    local_98->loop_filter_ref_deltas[4] = -1;
    local_98->loop_filter_ref_deltas[5] = '\0';
    local_98->loop_filter_ref_deltas[6] = -1;
    local_98->loop_filter_ref_deltas[7] = -1;
LAB_001bba11:
    local_98->loop_filter_mode_deltas[0] = '\0';
    local_98->loop_filter_mode_deltas[1] = '\0';
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","cdef in %d","mpp_av1_uncompressed_header");
  }
  if (((ctx->coded_lossless == 0) && (local_98->allow_intrabc == '\0')) &&
     (ctx->sequence_header->enable_cdef != '\0')) {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"cdef_damping_minus_3",&value,0,3);
    if (RVar12 < 0) {
      return RVar12;
    }
    local_98->cdef_damping_minus_3 = (byte)value;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"cdef_bits",&value,0,3);
    if (RVar12 < 0) {
      return -1;
    }
    local_98->cdef_bits = (byte)value;
    bVar20 = (byte)value;
    for (lVar18 = 0; lVar18 < 1 << (bVar20 & 0x1f); lVar18 = lVar18 + 1) {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,4,"cdef_y_pri_strength[i]",&value,0,0xf);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->cdef_y_pri_strength[lVar18] = (byte)value;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"cdef_y_sec_strength[i]",&value,0,3);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->cdef_y_sec_strength[lVar18] = (byte)value;
      if (1 < ctx->num_planes) {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,4,"cdef_uv_pri_strength[i]",&value,0,0xf);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->cdef_uv_pri_strength[lVar18] = (byte)value;
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"cdef_uv_sec_strength[i]",&value,0,3);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->cdef_uv_sec_strength[lVar18] = (byte)value;
      }
      bVar20 = local_98->cdef_bits;
    }
  }
  else {
    local_98->cdef_damping_minus_3 = '\0';
    local_98->cdef_bits = '\0';
    local_98->cdef_y_pri_strength[0] = '\0';
    local_98->cdef_y_sec_strength[0] = '\0';
    local_98->cdef_uv_pri_strength[0] = '\0';
    local_98->cdef_uv_sec_strength[0] = '\0';
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","lr in %d","mpp_av1_uncompressed_header");
  }
  if (((ctx->all_lossless == 0) && (local_98->allow_intrabc == '\0')) &&
     (local_78 = ctx->sequence_header, local_78->enable_restoration != '\0')) {
    bVar41 = false;
    bVar7 = false;
    for (lVar18 = 0; lVar18 < ctx->num_planes; lVar18 = lVar18 + 1) {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"lr_type[i]",&value,0,3);
      if (RVar12 < 0) {
        return -1;
      }
      if ((byte)value != '\0') {
        bVar41 = true;
      }
      local_98->lr_type[lVar18] = (byte)value;
      bVar8 = true;
      if ((byte)value == '\0') {
        bVar8 = bVar7;
      }
      if (lVar18 != 0) {
        bVar7 = bVar8;
      }
    }
    if (bVar41) {
      RVar12 = mpp_av1_read_increment
                         (&local_90->gb,(uint)(local_78->use_128x128_superblock != '\0'),2,
                          "lr_unit_shift",&value);
      if (RVar12 < 0) {
        return -1;
      }
      local_98->lr_unit_shift = (byte)value;
      if ((((local_78->color_config).subsampling_x == '\0') ||
          ((local_78->color_config).subsampling_y == '\0')) || (!bVar7)) {
        local_98->lr_uv_shift = '\0';
      }
      else {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"lr_uv_shift",&value,0,1);
        if (RVar12 < 0) {
          return -1;
        }
        local_98->lr_uv_shift = (byte)value;
      }
    }
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","read_tx in %d","mpp_av1_uncompressed_header");
  }
  if (ctx->coded_lossless == 0) {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"tx_mode",&value,0,1);
    if (RVar12 < 0) {
      return RVar12;
    }
    local_98->tx_mode = '\x02' - ((byte)value == '\0');
  }
  else {
    local_98->tx_mode = '\0';
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","reference in%d","mpp_av1_uncompressed_header");
  }
  if ((*local_58 & 0xfd) == 0) {
    local_98->reference_select = '\0';
  }
  else {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"reference_select",&value,0,1);
    if (RVar12 < 0) {
      return RVar12;
    }
    local_98->reference_select = (byte)value;
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","kip_mode in %d","mpp_av1_uncompressed_header");
  }
  pAVar30 = ctx->sequence_header;
  ctx->skip_ref0 = '\0';
  ctx->skip_ref1 = '\0';
  if ((((*local_58 & 0xfd) == 0) || (local_98->reference_select == '\0')) ||
     (pAVar30->enable_order_hint == '\0')) {
LAB_001bbc6c:
    local_98->skip_mode_present = '\0';
  }
  else {
    local_78 = (AV1RawSequenceHeader *)ctx->ref_s;
    RVar16 = ctx->order_hint;
    uVar37 = 0xffffffff;
    local_68 = (RK_S16 (*) [8])CONCAT44(local_68._4_4_,0xffffffff);
    local_70 = (RK_U8 (*) [8])CONCAT44(local_70._4_4_,0xffffffff);
    local_50._0_4_ = 0xffffffff;
    for (uVar40 = 0; uVar14 = (uint)uVar37, uVar40 != 7; uVar40 = uVar40 + 1) {
      RVar26 = *(RK_U32 *)
                (local_78->operating_point_idc + (long)local_98->ref_frame_idx[uVar40] * 0x7e + 4);
      RVar12 = mpp_av1_get_relative_dist(pAVar30,RVar26,RVar16);
      if (RVar12 < 0) {
        if (-1 < (int)(uint)local_70) {
          RVar12 = mpp_av1_get_relative_dist(pAVar30,RVar26,(RK_U32)local_68);
          if (RVar12 < 1) goto LAB_001bbf46;
        }
        local_70 = (RK_U8 (*) [8])CONCAT44(local_70._4_4_,(int)uVar40);
        local_68 = (RK_S16 (*) [8])CONCAT44(local_68._4_4_,RVar26);
      }
      else if ((RVar12 != 0) &&
              (((int)uVar14 < 0 ||
               (RVar12 = mpp_av1_get_relative_dist(pAVar30,RVar26,(RK_U32)local_50), RVar12 < 0))))
      {
        uVar37 = uVar40 & 0xffffffff;
        local_50._0_4_ = RVar26;
      }
LAB_001bbf46:
    }
    if ((int)(uint)local_70 < 0) goto LAB_001bbc6c;
    if ((int)uVar14 < 0) {
      uVar37 = 0xffffffffffffffff;
      for (uVar40 = 0; iVar32 = (int)uVar37, uVar40 != 7; uVar40 = uVar40 + 1) {
        RVar26 = *(RK_U32 *)
                  (local_78->operating_point_idc + (long)local_98->ref_frame_idx[uVar40] * 0x7e + 4)
        ;
        RVar12 = mpp_av1_get_relative_dist(pAVar30,RVar26,(RK_U32)local_68);
        if ((RVar12 < 0) &&
           ((iVar32 < 0 || (RVar12 = mpp_av1_get_relative_dist(pAVar30,RVar26,RVar16), 0 < RVar12)))
           ) {
          uVar37 = uVar40 & 0xffffffff;
          RVar16 = RVar26;
        }
      }
      if (iVar32 < 0) goto LAB_001bbc6c;
      cVar23 = (char)uVar37;
      if ((int)(uint)local_70 < iVar32) {
        cVar23 = (char)local_70;
      }
      cVar21 = (char)uVar37;
      if (iVar32 < (int)(uint)local_70) {
        cVar21 = (char)local_70;
      }
    }
    else {
      uVar40 = uVar37;
      if ((uint)local_70 >= uVar14 && (uint)local_70 != uVar14) {
        uVar40 = (ulong)local_70 & 0xffffffff;
      }
      if ((uint)local_70 < uVar14) {
        uVar37 = (ulong)local_70 & 0xffffffff;
      }
      cVar23 = (char)uVar37;
      cVar21 = (char)uVar40;
    }
    ctx->skip_ref0 = cVar23 + '\x01';
    ctx->skip_ref1 = cVar21 + '\x01';
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"skip_mode_present",&value,0,1);
    if (RVar12 < 0) {
      return RVar12;
    }
    local_98->skip_mode_present = (byte)value;
  }
  if (((local_81 == 0) && (local_98->error_resilient_mode == '\0')) &&
     (local_80->enable_warped_motion != '\0')) {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"allow_warped_motion",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    local_98->allow_warped_motion = (byte)value;
  }
  else {
    local_98->allow_warped_motion = '\0';
  }
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"reduced_tx_set",&value,0,1);
  if (RVar12 < 0) {
    return -1;
  }
  local_98->reduced_tx_set = (byte)value;
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","motion in%d","mpp_av1_uncompressed_header");
  }
  if ((*local_58 & 0xfd) != 0) {
    iVar32 = 1;
    lVar29 = 0x2a5;
    for (lVar18 = 0x2d8; lVar18 != 0x380; lVar18 = lVar18 + 0x18) {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"is_global[ref]",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      *(byte *)((long)local_98->buffer_removal_time + lVar29 + -0x2c) = (byte)value;
      if ((byte)value != '\0') {
        RVar13 = 1;
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"is_rot_zoom[ref]",&value,0,1);
        if (RVar12 < 0) {
          return -1;
        }
        cVar23 = (byte)value;
        *(byte *)((long)local_98->buffer_removal_time + lVar29 + -0x24) = (byte)value;
        pAVar42 = (AV1RawFrameHeader *)0x2;
        if ((byte)value == '\0') {
          RVar13 = 1;
          RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"is_translation[ref]",&value,0,1);
          if (RVar12 < 0) {
            return -1;
          }
          *(byte *)((long)local_98->buffer_removal_time + lVar29 + -0x1c) = (byte)value;
          pAVar42 = (AV1RawFrameHeader *)0x3;
          if ((byte)value == '\0') goto LAB_001bc3f1;
          iVar25 = (int)lVar29 + -0x2a4;
          pAVar42 = (AV1RawFrameHeader *)0x1;
        }
        else {
LAB_001bc3f1:
          iVar39 = (int)lVar29 + -0x2a4;
          RVar12 = mpp_av1_global_motion_param
                             (local_90,(BitReadCtx_t *)local_98,pAVar42,iVar39,2,RVar13);
          if (RVar12 < 0) {
            return -1;
          }
          RVar12 = mpp_av1_global_motion_param
                             (local_90,(BitReadCtx_t *)local_98,pAVar42,iVar39,3,RVar13);
          if (RVar12 < 0) {
            return -1;
          }
          iVar25 = iVar32;
          if (cVar23 == '\0') {
            RVar12 = mpp_av1_global_motion_param
                               (local_90,(BitReadCtx_t *)local_98,(AV1RawFrameHeader *)0x3,iVar39,4,
                                RVar13);
            if (RVar12 < 0) {
              return -1;
            }
            pAVar42 = (AV1RawFrameHeader *)0x3;
            RVar12 = mpp_av1_global_motion_param
                               (local_90,(BitReadCtx_t *)local_98,(AV1RawFrameHeader *)0x3,iVar39,5,
                                RVar13);
            if (RVar12 < 0) {
              return -1;
            }
          }
          else {
            *(int *)((long)local_98->buffer_removal_time + lVar18 + -0x20) =
                 -*(int *)((long)local_98->buffer_removal_time + lVar18 + -0x24);
            *(undefined4 *)((long)local_98->buffer_removal_time + lVar18 + -0x1c) =
                 *(undefined4 *)((long)local_98->buffer_removal_time + lVar18 + -0x28);
            pAVar42 = (AV1RawFrameHeader *)0x2;
          }
        }
        RVar12 = mpp_av1_global_motion_param
                           (local_90,(BitReadCtx_t *)local_98,pAVar42,iVar25,0,RVar13);
        if (RVar12 < 0) {
          return -1;
        }
        RVar12 = mpp_av1_global_motion_param
                           (local_90,(BitReadCtx_t *)local_98,pAVar42,iVar25,1,RVar13);
        if (RVar12 < 0) {
          return -1;
        }
      }
      iVar32 = iVar32 + 1;
      lVar29 = lVar29 + 1;
    }
  }
  if ((av1d_debug & 2) != 0) {
    mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","grain in %d","mpp_av1_uncompressed_header");
  }
  pAVar30 = ctx->sequence_header;
  if ((pAVar30->film_grain_params_present == '\0') ||
     ((local_98->show_frame == '\0' && (local_98->showable_frame == '\0')))) goto LAB_001bcff6;
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"apply_grain",&value,0,1);
  if (RVar12 < 0) {
    return RVar12;
  }
  (local_98->film_grain).apply_grain = (byte)value;
  if ((byte)value == '\0') goto LAB_001bcff6;
  RVar12 = mpp_av1_read_unsigned(&local_90->gb,0x10,"grain_seed",&value,0,0xffff);
  if (RVar12 < 0) {
    return -1;
  }
  (local_98->film_grain).grain_seed = (RK_U16)value;
  if (local_98->frame_type == '\x01') {
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"update_grain",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    (local_98->film_grain).update_grain = (byte)value;
    if ((byte)value != '\0') goto LAB_001bc6d9;
    iVar32 = 0;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,3,"film_grain_params_ref_idx",&value,0,7);
    if (RVar12 < 0) goto LAB_001bcfe6;
    (local_98->film_grain).film_grain_params_ref_idx = (byte)value;
  }
  else {
    (local_98->film_grain).update_grain = '\x01';
LAB_001bc6d9:
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,4,"num_y_points",&value,0,0xe);
    if (RVar12 < 0) {
      return -1;
    }
    (local_98->film_grain).num_y_points = (byte)value;
    bVar20 = (byte)value;
    for (uVar37 = 0; uVar37 < bVar20; uVar37 = uVar37 + 1) {
      if (uVar37 == 0) {
        RVar16 = 0;
      }
      else {
        RVar16 = (local_98->film_grain).point_y_value[uVar37 - 1] + 1;
      }
      RVar12 = mpp_av1_read_unsigned
                         (&local_90->gb,8,"point_y_value[i]",&value,RVar16,
                          ((int)uVar37 - (uint)bVar20) + 0x100);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).point_y_value[uVar37] = (byte)value;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"point_y_scaling[i]",&value,0,0xff);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).point_y_scaling[uVar37] = (byte)value;
      bVar20 = (local_98->film_grain).num_y_points;
    }
    if ((pAVar30->color_config).mono_chrome == '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"chroma_scaling_from_luma",&value,0,1);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).chroma_scaling_from_luma = (RK_U8)value;
      if (((RK_U8)value != '\0' || (pAVar30->color_config).mono_chrome != '\0') ||
         ((((pAVar30->color_config).subsampling_x == '\x01' &&
           ((pAVar30->color_config).subsampling_y == '\x01')) &&
          ((local_98->film_grain).num_y_points == '\0')))) goto LAB_001bc9bd;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,4,"num_cb_points",&value,0,10);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).num_cb_points = (byte)value;
      bVar20 = (byte)value;
      for (uVar37 = 0; uVar37 < bVar20; uVar37 = uVar37 + 1) {
        if (uVar37 == 0) {
          RVar16 = 0;
        }
        else {
          RVar16 = (local_98->film_grain).point_cb_value[uVar37 - 1] + 1;
        }
        RVar12 = mpp_av1_read_unsigned
                           (&local_90->gb,8,"point_cb_value[i]",&value,RVar16,
                            ((int)uVar37 - (uint)bVar20) + 0x100);
        if (RVar12 < 0) {
          return -1;
        }
        (local_98->film_grain).point_cb_value[uVar37] = (byte)value;
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"point_cb_scaling[i]",&value,0,0xff);
        if (RVar12 < 0) {
          return -1;
        }
        (local_98->film_grain).point_cb_scaling[uVar37] = (byte)value;
        bVar20 = (local_98->film_grain).num_cb_points;
      }
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,4,"num_cr_points",&value,0,10);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).num_cr_points = (byte)value;
      bVar20 = (byte)value;
      for (uVar37 = 0; uVar37 < bVar20; uVar37 = uVar37 + 1) {
        if (uVar37 == 0) {
          RVar16 = 0;
        }
        else {
          RVar16 = (local_98->film_grain).point_cr_value[uVar37 - 1] + 1;
        }
        RVar12 = mpp_av1_read_unsigned
                           (&local_90->gb,8,"point_cr_value[i]",&value,RVar16,
                            ((int)uVar37 - (uint)bVar20) + 0x100);
        if (RVar12 < 0) {
          return -1;
        }
        (local_98->film_grain).point_cr_value[uVar37] = (byte)value;
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"point_cr_scaling[i]",&value,0,0xff);
        if (RVar12 < 0) {
          return -1;
        }
        (local_98->film_grain).point_cr_scaling[uVar37] = (byte)value;
        bVar20 = (local_98->film_grain).num_cr_points;
      }
    }
    else {
      (local_98->film_grain).chroma_scaling_from_luma = '\0';
LAB_001bc9bd:
      (local_98->film_grain).num_cb_points = '\0';
      (local_98->film_grain).num_cr_points = '\0';
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"grain_scaling_minus_8",&value,0,3);
    if (RVar12 < 0) {
      return -1;
    }
    (local_98->film_grain).grain_scaling_minus_8 = (byte)value;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"ar_coeff_lag",&value,0,3);
    if (RVar12 < 0) {
      return -1;
    }
    (local_98->film_grain).ar_coeff_lag = (RK_U8)value;
    uVar14 = ((value & 0xff) + 1) * (value & 0xff) * 2;
    uVar37 = (ulong)uVar14;
    if ((local_98->film_grain).num_y_points != '\0') {
      uVar37 = (ulong)(uVar14 | 1);
      for (uVar40 = 0; uVar14 != uVar40; uVar40 = uVar40 + 1) {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"ar_coeffs_y_plus_128[i]",&value,0,0xff);
        if (RVar12 < 0) {
          return -1;
        }
        (local_98->film_grain).ar_coeffs_y_plus_128[uVar40] = (byte)value;
      }
    }
    if (((local_98->film_grain).chroma_scaling_from_luma == '\0') &&
       ((local_98->film_grain).num_cb_points == '\0')) {
LAB_001bcd40:
      if ((local_98->film_grain).num_cr_points != '\0') goto LAB_001bcd4e;
    }
    else {
      for (uVar40 = 0; uVar37 != uVar40; uVar40 = uVar40 + 1) {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"ar_coeffs_cb_plus_128[i]",&value,0,0xff);
        if (RVar12 < 0) {
          return -1;
        }
        (local_98->film_grain).ar_coeffs_cb_plus_128[uVar40] = (byte)value;
      }
      if ((local_98->film_grain).chroma_scaling_from_luma == '\0') goto LAB_001bcd40;
LAB_001bcd4e:
      for (uVar40 = 0; uVar37 != uVar40; uVar40 = uVar40 + 1) {
        RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"ar_coeffs_cr_plus_128[i]",&value,0,0xff);
        if (RVar12 < 0) {
          return -1;
        }
        (local_98->film_grain).ar_coeffs_cr_plus_128[uVar40] = (byte)value;
      }
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"ar_coeff_shift_minus_6",&value,0,3);
    if (RVar12 < 0) {
      return -1;
    }
    (local_98->film_grain).ar_coeff_shift_minus_6 = (byte)value;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,2,"grain_scale_shift",&value,0,3);
    if (RVar12 < 0) {
      return -1;
    }
    (local_98->film_grain).grain_scale_shift = (byte)value;
    if ((local_98->film_grain).num_cb_points != '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"cb_mult",&value,0,0xff);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).cb_mult = (byte)value;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"cb_luma_mult",&value,0,0xff);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).cb_luma_mult = (byte)value;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,9,"cb_offset",&value,0,0x1ff);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).cb_offset = (RK_U16)value;
    }
    if ((local_98->film_grain).num_cr_points != '\0') {
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"cr_mult",&value,0,0xff);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).cr_mult = (byte)value;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,8,"cr_luma_mult",&value,0,0xff);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).cr_luma_mult = (byte)value;
      RVar12 = mpp_av1_read_unsigned(&local_90->gb,9,"cr_offset",&value,0,0x1ff);
      if (RVar12 < 0) {
        return -1;
      }
      (local_98->film_grain).cr_offset = (RK_U16)value;
    }
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"overlap_flag",&value,0,1);
    if (RVar12 < 0) {
      return -1;
    }
    (local_98->film_grain).overlap_flag = (byte)value;
    iVar32 = 0;
    RVar12 = mpp_av1_read_unsigned(&local_90->gb,1,"clip_to_restricted_range",&value,0,1);
    if (RVar12 < 0) {
LAB_001bcfe6:
      iVar32 = -1;
    }
    else {
      (local_98->film_grain).clip_to_restricted_range = (byte)value;
    }
  }
  if (iVar32 < 0) {
    return -1;
  }
LAB_001bcff6:
  if ((av1d_debug & 2) != 0) {
    uVar14 = mpp_get_bits_count(&local_90->gb);
    _mpp_log_l(4,"av1d_cbs","film_grain out %d","mpp_av1_uncompressed_header",(ulong)uVar14);
  }
  if ((av1d_debug & 4) != 0) {
    local_98 = (AV1RawFrameHeader *)(ulong)(uint)ctx->frame_height;
    local_90 = (AV1Context *)(ulong)(uint)ctx->upscaled_width;
    _mpp_log_l(4,"av1d_cbs",
               "Frame %d:  size %dx%d  upscaled %d  render %dx%d  subsample %dx%d  bitdepth %d  tiles %dx%d.\n"
               ,"mpp_av1_uncompressed_header",(ulong)(uint)ctx->order_hint,
               (ulong)(uint)ctx->frame_width,local_98,local_90,(ulong)(uint)ctx->render_width,
               (ulong)(uint)ctx->render_height,(ulong)((local_80->color_config).subsampling_x + 1),
               (ulong)((local_80->color_config).subsampling_y + 1),(ulong)(uint)ctx->bit_depth,
               (ulong)(uint)ctx->tile_rows,(ulong)(uint)ctx->tile_cols);
    return 0;
  }
  return 0;
}

Assistant:

static RK_S32 mpp_av1_uncompressed_header(AV1Context *ctx, BitReadCtx_t *gb,
                                          AV1RawFrameHeader *current)
{
    const AV1RawSequenceHeader *seq;
    RK_S32 id_len, diff_len, all_frames, frame_is_intra, order_hint_bits;
    RK_S32 i, err;

    if (!ctx->sequence_header) {
        mpp_err_f("No sequence header available: "
                  "unable to decode frame header.\n");
        return MPP_ERR_UNKNOW;
    }
    seq = ctx->sequence_header;

    id_len = seq->additional_frame_id_length_minus_1 +
             seq->delta_frame_id_length_minus_2 + 3;
    all_frames = (1 << AV1_NUM_REF_FRAMES) - 1;

    if (seq->reduced_still_picture_header) {
        infer(show_existing_frame, 0);
        infer(frame_type,     AV1_FRAME_KEY);
        infer(show_frame,     1);
        infer(showable_frame, 0);
        frame_is_intra = 1;

    } else {
        flag(show_existing_frame);

        if (current->show_existing_frame) {
            AV1ReferenceFrameState *ref;

            fb(3, frame_to_show_map_idx);
            ref = &ctx->ref_s[current->frame_to_show_map_idx];

            if (!ref->valid) {
                mpp_err_f("Missing reference frame needed for "
                          "show_existing_frame (frame_to_show_map_idx = %d).\n",
                          current->frame_to_show_map_idx);
                return MPP_ERR_UNKNOW;
            }

            if (seq->decoder_model_info_present_flag &&
                !seq->timing_info.equal_picture_interval) {
                fb(seq->decoder_model_info.frame_presentation_time_length_minus_1 + 1,
                   frame_presentation_time);
            }

            if (seq->frame_id_numbers_present_flag)
                fb(id_len, display_frame_id);

            infer(frame_type, ref->frame_type);
            if (current->frame_type == AV1_FRAME_KEY) {
                infer(refresh_frame_flags, all_frames);

                // Section 7.21
                infer(current_frame_id, ref->frame_id);
                ctx->upscaled_width  = ref->upscaled_width;
                ctx->frame_width     = ref->frame_width;
                ctx->frame_height    = ref->frame_height;
                ctx->render_width    = ref->render_width;
                ctx->render_height   = ref->render_height;
                ctx->bit_depth       = ref->bit_depth;
                ctx->order_hint      = ref->order_hint;
            } else
                infer(refresh_frame_flags, 0);

            infer(frame_width_minus_1,   ref->upscaled_width - 1);
            infer(frame_height_minus_1,  ref->frame_height - 1);
            infer(render_width_minus_1,  ref->render_width - 1);
            infer(render_height_minus_1, ref->render_height - 1);

            return 0;
        }

        fb(2, frame_type);
        frame_is_intra = (current->frame_type == AV1_FRAME_INTRA_ONLY ||
                          current->frame_type == AV1_FRAME_KEY);

        ctx->frame_is_intra = frame_is_intra;
        if (current->frame_type == AV1_FRAME_KEY) {
            RK_U32 refresh_frame_flags = (1 << NUM_REF_FRAMES) - 1;

            Av1GetCDFs(ctx, current->frame_to_show_map_idx);
            Av1StoreCDFs(ctx, refresh_frame_flags);
        }

        flag(show_frame);
        if (current->show_frame &&
            seq->decoder_model_info_present_flag &&
            !seq->timing_info.equal_picture_interval) {
            fb(seq->decoder_model_info.frame_presentation_time_length_minus_1 + 1,
               frame_presentation_time);
        }
        if (current->show_frame)
            infer(showable_frame, current->frame_type != AV1_FRAME_KEY);
        else
            flag(showable_frame);

        if (current->frame_type == AV1_FRAME_SWITCH ||
            (current->frame_type == AV1_FRAME_KEY && current->show_frame))
            infer(error_resilient_mode, 1);
        else
            flag(error_resilient_mode);
    }

    if (current->frame_type == AV1_FRAME_KEY && current->show_frame) {
        for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
            ctx->ref_s[i].valid = 0;
            ctx->ref_s[i].order_hint = 0;
        }
    }

    flag(disable_cdf_update);

    if (seq->seq_force_screen_content_tools ==
        AV1_SELECT_SCREEN_CONTENT_TOOLS) {
        flag(allow_screen_content_tools);
    } else {
        infer(allow_screen_content_tools,
              seq->seq_force_screen_content_tools);
    }
    if (current->allow_screen_content_tools) {
        if (seq->seq_force_integer_mv == AV1_SELECT_INTEGER_MV)
            flag(force_integer_mv);
        else
            infer(force_integer_mv, seq->seq_force_integer_mv);
    } else {
        infer(force_integer_mv, 0);
    }

    if (seq->frame_id_numbers_present_flag) {
        fb(id_len, current_frame_id);

        diff_len = seq->delta_frame_id_length_minus_2 + 2;
        for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
            if (current->current_frame_id > (RK_S32)(1 << diff_len)) {
                if (ctx->ref_s[i].frame_id > current->current_frame_id ||
                    ctx->ref_s[i].frame_id < (current->current_frame_id -
                                              (RK_S32)(1 << diff_len)))
                    ctx->ref_s[i].valid = 0;
            } else {
                if (ctx->ref_s[i].frame_id > current->current_frame_id &&
                    ctx->ref_s[i].frame_id < ((RK_S32)(1 << id_len) +
                                              current->current_frame_id -
                                              (RK_S32)(1 << diff_len)))
                    ctx->ref_s[i].valid = 0;
            }
        }
    } else {
        infer(current_frame_id, 0);
    }

    if (current->frame_type == AV1_FRAME_SWITCH)
        infer(frame_size_override_flag, 1);
    else if (seq->reduced_still_picture_header)
        infer(frame_size_override_flag, 0);
    else
        flag(frame_size_override_flag);

    order_hint_bits =
        seq->enable_order_hint ? seq->order_hint_bits_minus_1 + 1 : 0;
    if (order_hint_bits > 0)
        fb(order_hint_bits, order_hint);
    else
        infer(order_hint, 0);
    ctx->order_hint = current->order_hint;

    if (frame_is_intra || current->error_resilient_mode)
        infer(primary_ref_frame, AV1_PRIMARY_REF_NONE);
    else
        fb(3, primary_ref_frame);

    if (seq->decoder_model_info_present_flag) {
        flag(buffer_removal_time_present_flag);
        if (current->buffer_removal_time_present_flag) {
            for (i = 0; i <= seq->operating_points_cnt_minus_1; i++) {
                if (seq->decoder_model_present_for_this_op[i]) {
                    RK_S32 op_pt_idc = seq->operating_point_idc[i];
                    RK_S32 in_temporal_layer = (op_pt_idc >>  ctx->temporal_id    ) & 1;
                    RK_S32 in_spatial_layer  = (op_pt_idc >> (ctx->spatial_id + 8)) & 1;
                    if (seq->operating_point_idc[i] == 0 ||
                        (in_temporal_layer && in_spatial_layer)) {
                        fbs(seq->decoder_model_info.buffer_removal_time_length_minus_1 + 1,
                            buffer_removal_time[i], 1, i);
                    }
                }
            }
        }
    }

    if (current->frame_type == AV1_FRAME_SWITCH ||
        (current->frame_type == AV1_FRAME_KEY && current->show_frame))
        infer(refresh_frame_flags, all_frames);
    else
        fb(8, refresh_frame_flags);

    ctx->refresh_frame_flags = current->refresh_frame_flags;
    if (!frame_is_intra || current->refresh_frame_flags != all_frames) {
        if (seq->enable_order_hint) {
            for (i = 0; i < AV1_NUM_REF_FRAMES; i++) {
                if (current->error_resilient_mode)
                    fbs(order_hint_bits, ref_order_hint[i], 1, i);
                else
                    infer(ref_order_hint[i], ctx->ref_s[i].order_hint);
                if (current->ref_order_hint[i] != ctx->ref_s[i].order_hint)
                    ctx->ref_s[i].valid = 0;
            }
        }
    }

    current->ref_frame_valued = 1;
    if (current->frame_type == AV1_FRAME_KEY ||
        current->frame_type == AV1_FRAME_INTRA_ONLY) {
        CHECK(mpp_av1_frame_size(ctx, gb, current));
        CHECK(mpp_av1_render_size(ctx, gb, current));

        if (current->allow_screen_content_tools &&
            ctx->upscaled_width == ctx->frame_width)
            flag(allow_intrabc);
        else
            infer(allow_intrabc, 0);

        current->ref_frame_valued = 0;
    } else {
        if (!seq->enable_order_hint) {
            infer(frame_refs_short_signaling, 0);
        } else {
            flag(frame_refs_short_signaling);
            if (current->frame_refs_short_signaling) {
                fb(3, last_frame_idx);
                fb(3, golden_frame_idx);
                CHECK(mpp_av1_set_frame_refs(ctx, gb, current));
            }
        }

        for (i = 0; i < AV1_REFS_PER_FRAME; i++) {
            if (!current->frame_refs_short_signaling)
                fbs(3, ref_frame_idx[i], 1, i);
            if (seq->frame_id_numbers_present_flag) {
                fbs(seq->delta_frame_id_length_minus_2 + 2,
                    delta_frame_id_minus1[i], 1, i);
            }
        }

        if (current->frame_size_override_flag &&
            !current->error_resilient_mode) {
            CHECK(mpp_av1_frame_size_with_refs(ctx, gb, current));
        } else {
            CHECK(mpp_av1_frame_size(ctx, gb, current));
            CHECK(mpp_av1_render_size(ctx, gb, current));
        }

        if (current->force_integer_mv)
            infer(allow_high_precision_mv, 0);
        else
            flag(allow_high_precision_mv);

        CHECK(mpp_av1_interpolation_filter(ctx, gb, current));

        flag(is_motion_mode_switchable);

        if (current->error_resilient_mode ||
            !seq->enable_ref_frame_mvs)
            infer(use_ref_frame_mvs, 0);
        else
            flag(use_ref_frame_mvs);

        infer(allow_intrabc, 0);
    }

    if (!frame_is_intra) {
        // Derive reference frame sign biases.
    }

    if (seq->reduced_still_picture_header || current->disable_cdf_update)
        infer(disable_frame_end_update_cdf, 1);
    else
        flag(disable_frame_end_update_cdf);

    ctx->disable_frame_end_update_cdf = current->disable_frame_end_update_cdf;

    if (current->use_ref_frame_mvs) {
        // Perform motion field estimation process.
    }
    av1d_dbg(AV1D_DBG_HEADER, "ptile_info in %d", mpp_get_bits_count(gb));
    CHECK(mpp_av1_tile_info(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "ptile_info out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_quantization_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "quantization out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_segmentation_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "segmentation out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_delta_q_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "delta_q out %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_delta_lf_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "lf out %d", mpp_get_bits_count(gb));

    // Init coeff CDFs / load previous segments.
    if (current->error_resilient_mode || frame_is_intra || current->primary_ref_frame == AV1_PRIMARY_REF_NONE) {
        // Init non-coeff CDFs.
        // Setup past independence.
        ctx->cdfs = &ctx->default_cdfs;
        ctx->cdfs_ndvc = &ctx->default_cdfs_ndvc;
        Av1DefaultCoeffProbs(current->base_q_idx, ctx->cdfs);
    } else {
        // Load CDF tables from previous frame.
        // Load params from previous frame.
        RK_U32 idx = current->ref_frame_idx[current->primary_ref_frame];

        Av1GetCDFs(ctx, idx);
    }
    av1d_dbg(AV1D_DBG_HEADER, "show_existing_frame_index %d primary_ref_frame %d %d (%d) refresh_frame_flags %d base_q_idx %d\n",
             current->frame_to_show_map_idx,
             current->ref_frame_idx[current->primary_ref_frame],
             ctx->ref[current->ref_frame_idx[current->primary_ref_frame]].slot_index,
             current->primary_ref_frame,
             current->refresh_frame_flags,
             current->base_q_idx);
    Av1StoreCDFs(ctx, current->refresh_frame_flags);

    ctx->coded_lossless = 1;
    for (i = 0; i < AV1_MAX_SEGMENTS; i++) {
        RK_S32 qindex;
        if (current->feature_enabled[i][AV1_SEG_LVL_ALT_Q]) {
            qindex = (current->base_q_idx +
                      current->feature_value[i][AV1_SEG_LVL_ALT_Q]);
        } else {
            qindex = current->base_q_idx;
        }
        qindex = mpp_clip_uintp2(qindex, 8);

        if (qindex                || current->delta_q_y_dc ||
            current->delta_q_u_ac || current->delta_q_u_dc ||
            current->delta_q_v_ac || current->delta_q_v_dc) {
            ctx->coded_lossless = 0;
        }
    }
    ctx->all_lossless = ctx->coded_lossless &&
                        ctx->frame_width == ctx->upscaled_width;
    av1d_dbg(AV1D_DBG_HEADER, "filter in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_loop_filter_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "cdef in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_cdef_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "lr in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_lr_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "read_tx in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_read_tx_mode(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "reference in%d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_frame_reference_mode(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "kip_mode in %d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_skip_mode_params(ctx, gb, current));

    if (frame_is_intra || current->error_resilient_mode ||
        !seq->enable_warped_motion)
        infer(allow_warped_motion, 0);
    else
        flag(allow_warped_motion);

    flag(reduced_tx_set);
    av1d_dbg(AV1D_DBG_HEADER, "motion in%d", mpp_get_bits_count(gb));

    CHECK(mpp_av1_global_motion_params(ctx, gb, current));
    av1d_dbg(AV1D_DBG_HEADER, "grain in %d", mpp_get_bits_count(gb));
    CHECK(mpp_av1_film_grain_params(ctx, gb, &current->film_grain, current));
    av1d_dbg(AV1D_DBG_HEADER, "film_grain out %d", mpp_get_bits_count(gb));

    av1d_dbg(AV1D_DBG_REF, "Frame %d:  size %dx%d  "
             "upscaled %d  render %dx%d  subsample %dx%d  "
             "bitdepth %d  tiles %dx%d.\n", ctx->order_hint,
             ctx->frame_width, ctx->frame_height, ctx->upscaled_width,
             ctx->render_width, ctx->render_height,
             seq->color_config.subsampling_x + 1,
             seq->color_config.subsampling_y + 1, ctx->bit_depth,
             ctx->tile_rows, ctx->tile_cols);

    return 0;
}